

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveModel(FastText *this)

{
  element_type *peVar1;
  long in_RDI;
  string fn;
  string *in_stack_000001e8;
  FastText *in_stack_000001f0;
  string local_58 [48];
  string local_28 [40];
  
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x159228);
  std::__cxx11::string::string(local_28,(string *)&peVar1->output);
  if ((*(byte *)(in_RDI + 0x88) & 1) == 0) {
    std::__cxx11::string::operator+=(local_28,".bin");
  }
  else {
    std::__cxx11::string::operator+=(local_28,".ftz");
  }
  std::__cxx11::string::string(local_58,local_28);
  saveModel(in_stack_000001f0,in_stack_000001e8);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void FastText::saveModel() {
  std::string fn(args_->output);
  if (quant_) {
    fn += ".ftz";
  } else {
    fn += ".bin";
  }
  saveModel(fn);
}